

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeRefEq(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  RefEq *pRVar1;
  bool bVar2;
  Ok local_9d;
  uint local_9c;
  Err local_98;
  Err *local_68;
  Err *err;
  Result<wasm::Ok> _val;
  RefEq curr;
  IRBuilder *this_local;
  
  pRVar1 = (RefEq *)((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  RefEq::RefEq(pRVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitRefEq
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pRVar1);
  local_68 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_68 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_98,local_68);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_98);
    wasm::Err::~Err(&local_98);
  }
  local_9c = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_9c == 0) {
    pRVar1 = Builder::makeRefEq(&this->builder,
                                (Expression *)
                                curr.super_SpecificExpression<(wasm::Expression::Id)44>.
                                super_Expression.type.id,curr.left);
    push(this,(Expression *)pRVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_9d);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeRefEq() {
  RefEq curr;
  CHECK_ERR(visitRefEq(&curr));
  push(builder.makeRefEq(curr.left, curr.right));
  return Ok{};
}